

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall
jpge::jpeg_encoder::compute_huffman_table
          (jpeg_encoder *this,uint *codes,uint8 *code_sizes,uint8 *bits,uint8 *val)

{
  byte bVar1;
  long lVar2;
  int l;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint8 huff_size [257];
  uint huff_code [257];
  
  uVar8 = 0;
  for (lVar4 = 1; lVar4 != 0x11; lVar4 = lVar4 + 1) {
    bVar1 = bits[lVar4];
    for (lVar6 = (long)(int)uVar8; (int)(uVar8 + bVar1) != lVar6; lVar6 = lVar6 + 1) {
      huff_size[lVar6] = (uint8)lVar4;
    }
    uVar8 = uVar8 + bVar1;
  }
  huff_size[(int)uVar8] = '\0';
  uVar3 = (uint)huff_size[0];
  lVar4 = 0;
  uVar5 = 0;
  while (huff_size[0] != 0) {
    lVar6 = lVar4 << 0x20;
    lVar4 = (long)(int)lVar4;
    uVar7 = uVar5 * 2;
    while (uVar3 == huff_size[0]) {
      huff_code[lVar4] = uVar5;
      lVar2 = lVar4 + 1;
      lVar4 = lVar4 + 1;
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x100000000;
      uVar7 = uVar7 + 2;
      huff_size[0] = huff_size[lVar2];
    }
    uVar3 = uVar3 + 1;
    uVar5 = uVar7;
    huff_size[0] = huff_size[lVar6 >> 0x20];
  }
  uVar10 = 0;
  memset(codes,0,0x400);
  memset(code_sizes,0,0x100);
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    codes[val[uVar10]] = huff_code[uVar10];
    code_sizes[val[uVar10]] = huff_size[uVar10];
  }
  return;
}

Assistant:

void jpeg_encoder::compute_huffman_table(uint* codes, uint8* code_sizes, uint8* bits, uint8* val)
	{
		int i, l, last_p, si;
		uint8 huff_size[257];
		uint huff_code[257];
		uint code;

		int p = 0;
		for (l = 1; l <= 16; l++)
			for (i = 1; i <= bits[l]; i++)
				huff_size[p++] = (char)l;

		huff_size[p] = 0; last_p = p; // write sentinel

		code = 0; si = huff_size[0]; p = 0;

		while (huff_size[p])
		{
			while (huff_size[p] == si)
				huff_code[p++] = code++;
			code <<= 1;
			si++;
		}

		memset(codes, 0, sizeof(codes[0]) * 256);
		memset(code_sizes, 0, sizeof(code_sizes[0]) * 256);
		for (p = 0; p < last_p; p++)
		{
			codes[val[p]] = huff_code[p];
			code_sizes[val[p]] = huff_size[p];
		}
	}